

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

HelicsBroker helicsBrokerClone(HelicsBroker broker,HelicsError *err)

{
  BrokerObject *pBVar1;
  BrokerObject *pBVar2;
  _Head_base<0UL,_helics::BrokerObject_*,_false> local_30;
  BrokerObject *local_28;
  MasterObjectHolder *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pBVar1 = helics::getBrokerObject(broker,err);
  if (pBVar1 == (BrokerObject *)0x0) {
    pBVar2 = (BrokerObject *)0x0;
  }
  else {
    pBVar2 = (BrokerObject *)operator_new(0x18);
    (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pBVar2->index = -2;
    pBVar2->valid = -0x5cb982e0;
    (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pBVar1->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28 = pBVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(pBVar1->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    getMasterHolder();
    local_28 = (BrokerObject *)0x0;
    local_30._M_head_impl = pBVar2;
    MasterObjectHolder::addBroker
              (local_20,(unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         *)&local_30);
    if (local_30._M_head_impl != (BrokerObject *)0x0) {
      std::default_delete<helics::BrokerObject>::operator()
                ((default_delete<helics::BrokerObject> *)&local_30,local_30._M_head_impl);
    }
    local_30._M_head_impl = (BrokerObject *)0x0;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    if (local_28 != (BrokerObject *)0x0) {
      std::default_delete<helics::BrokerObject>::operator()
                ((default_delete<helics::BrokerObject> *)&local_28,local_28);
    }
  }
  return pBVar2;
}

Assistant:

HelicsBroker helicsBrokerClone(HelicsBroker broker, HelicsError* err)
{
    auto* brokerObj = helics::getBrokerObject(broker, err);
    if (brokerObj == nullptr) {
        return nullptr;
    }
    auto brokerClone = std::make_unique<helics::BrokerObject>();
    brokerClone->valid = gBrokerValidationIdentifier;
    brokerClone->brokerptr = brokerObj->brokerptr;
    auto* retbroker = reinterpret_cast<HelicsBroker>(brokerClone.get());
    getMasterHolder()->addBroker(std::move(brokerClone));
    return retbroker;
}